

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3ColumnFilter(int iCol,int bZero,char **ppList,int *pnList)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  long lVar11;
  int iCurrent;
  int local_44;
  char **local_40;
  int *local_38;
  
  pbVar5 = (byte *)*ppList;
  lVar11 = (long)*pnList;
  iCurrent = 0;
  pbVar9 = pbVar5 + lVar11;
  pbVar6 = pbVar5;
  local_44 = bZero;
  local_40 = ppList;
  local_38 = pnList;
  while( true ) {
    lVar8 = 0;
    bVar4 = 0;
    while ((pbVar1 = pbVar5 + lVar8, pbVar1 < pbVar9 && ((*pbVar1 & 0xfe) != 0 || bVar4 != 0))) {
      lVar8 = lVar8 + 1;
      bVar4 = *pbVar1 & 0x80;
    }
    if (iCurrent == iCol) break;
    uVar10 = ((int)lVar11 + (int)pbVar6) - (int)pbVar5;
    if (uVar10 == (uint)lVar8) {
      pbVar6 = pbVar5 + lVar8;
      iVar7 = 0;
LAB_0019ff56:
      if ((local_44 != 0) && (pbVar5 = pbVar6 + iVar7, pbVar5 != pbVar9)) {
        memset(pbVar5,0,(long)pbVar9 - (long)pbVar5);
      }
      *local_40 = (char *)pbVar6;
      *local_38 = iVar7;
      return;
    }
    if ((char)pbVar5[lVar8 + 1] < '\0') {
      uVar2 = sqlite3Fts3GetVarint32((char *)(pbVar5 + lVar8 + 1),&iCurrent);
      uVar3 = (ulong)uVar2;
    }
    else {
      uVar3 = 1;
      iCurrent = (int)(char)pbVar5[lVar8 + 1];
    }
    lVar11 = (ulong)uVar10 - lVar8;
    pbVar5 = pbVar5 + lVar8 + uVar3 + 1;
    pbVar6 = pbVar1;
  }
  iVar7 = (uint)lVar8 + ((int)pbVar5 - (int)pbVar6);
  goto LAB_0019ff56;
}

Assistant:

static void fts3ColumnFilter(
  int iCol,                       /* Column to filter on */
  int bZero,                      /* Zero out anything following *ppList */
  char **ppList,                  /* IN/OUT: Pointer to position list */
  int *pnList                     /* IN/OUT: Size of buffer *ppList in bytes */
){
  char *pList = *ppList;
  int nList = *pnList;
  char *pEnd = &pList[nList];
  int iCurrent = 0;
  char *p = pList;

  assert( iCol>=0 );
  while( 1 ){
    char c = 0;
    while( p<pEnd && (c | *p)&0xFE ) c = *p++ & 0x80;
  
    if( iCol==iCurrent ){
      nList = (int)(p - pList);
      break;
    }

    nList -= (int)(p - pList);
    pList = p;
    if( nList==0 ){
      break;
    }
    p = &pList[1];
    p += fts3GetVarint32(p, &iCurrent);
  }

  if( bZero && &pList[nList]!=pEnd ){
    memset(&pList[nList], 0, pEnd - &pList[nList]);
  }
  *ppList = pList;
  *pnList = nList;
}